

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

bool nivalis::detail::has_var_ast(AST *ast,uint32_t addr)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint in_ESI;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_RDI;
  size_t i;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size
                      (in_RDI);
    if (sVar2 <= local_20) {
      return false;
    }
    pvVar3 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
             operator[](in_RDI,local_20);
    bVar1 = OpCode::has_ref(pvVar3->opcode);
    if (((bVar1) &&
        (pvVar3 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                  operator[](in_RDI,local_20), pvVar3->opcode != 3)) &&
       (pvVar3 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                 operator[](in_RDI,local_20), (pvVar3->field_1).ref == (ulong)in_ESI)) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool has_var_ast(const Expr::AST& ast, uint32_t addr) {
    for (size_t i = 0; i < ast.size(); ++i) {
        if (OpCode::has_ref(ast[i].opcode) &&
            ast[i].opcode != OpCode::arg &&
            ast[i].ref == addr) {
            return true;
        }
    }
    return false;
}